

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# returnperiodtobin.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  allocator local_4a;
  allocator local_49;
  string local_48;
  string local_28;
  
  iVar1 = getopt(argc,argv,"vh");
  if (iVar1 == -1) {
    std::__cxx11::string::string((string *)&local_28,"",&local_49);
    std::__cxx11::string::string((string *)&local_48,"",&local_4a);
    initstreams(&local_28,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_28);
    doit();
    return 0;
  }
  if (iVar1 == 0x76) {
    fprintf(_stderr,"%s : version: %s\n",*argv,"");
  }
  else {
    help();
  }
  exit(1);
}

Assistant:

int main(int argc, char *argv[])
{
	int opt;
	while ((opt = getopt(argc, argv, "vh")) != -1) {
		switch (opt) {
		case 'v':
			fprintf(stderr, "%s : version: %s\n", argv[0], VERSION);
			::exit(EXIT_FAILURE);
			break;
		case 'h':
		default:
			help();
			::exit(EXIT_FAILURE);
		}
	}

	initstreams();
	doit();
	return EXIT_SUCCESS;
}